

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionBinsSelectExpr * __thiscall
slang::BumpAllocator::emplace<slang::ast::ConditionBinsSelectExpr,slang::ast::Symbol_const&>
          (BumpAllocator *this,Symbol *args)

{
  Symbol *target;
  ConditionBinsSelectExpr *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  target = (Symbol *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::ast::ConditionBinsSelectExpr::ConditionBinsSelectExpr(in_RSI,target);
  return (ConditionBinsSelectExpr *)target;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }